

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileString(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  byte *zIn;
  byte bVar1;
  int iVar2;
  sxi32 sVar3;
  jx9_value *pjVar4;
  ushort **ppuVar5;
  sxu32 nLen;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *zData;
  char *zData_00;
  long lVar9;
  long lVar10;
  long lStack_60;
  sxi32 iCons;
  jx9_gen_state *local_48;
  jx9_value *local_40;
  int c;
  int c_1;
  
  pbVar6 = (byte *)(pGen->pIn->sData).zString;
  pbVar8 = pbVar6 + (pGen->pIn->sData).nByte;
  iCons = 0;
  local_48 = pGen;
LAB_00126553:
  pjVar4 = (jx9_value *)0x0;
  pbVar7 = pbVar6;
LAB_00126555:
  do {
    pbVar6 = pbVar7 + 2;
    local_40 = pjVar4;
    for (lVar10 = 0; zIn = pbVar7 + lVar10, zIn < pbVar8; lVar10 = lVar10 + 1) {
      if (*zIn == 0x24) {
        if (pbVar7 + lVar10 + 1 < pbVar8) {
          bVar1 = pbVar7[lVar10 + 1];
          if (((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
              (ppuVar5 = __ctype_b_loc(), bVar1 == 0x5f)) ||
             (((*ppuVar5)[(char)bVar1] & 0x400) != 0)) break;
        }
      }
      else if (*zIn == 0x5c) break;
      pbVar6 = pbVar6 + 1;
    }
    pjVar4 = local_40;
    if (pbVar7 < zIn) {
      if ((local_40 == (jx9_value *)0x0) &&
         (pjVar4 = GenStateNewStrObj(local_48,&iCons), pjVar4 == (jx9_value *)0x0)) {
        return -10;
      }
      nLen = (sxu32)lVar10;
      zData = pbVar7;
    }
    else {
      if ((local_40 == (jx9_value *)0x0) &&
         (pjVar4 = GenStateNewStrObj(local_48,&iCons), pjVar4 == (jx9_value *)0x0)) {
        return -10;
      }
      zData = (byte *)0x13e424;
      nLen = 0;
    }
    jx9MemObjStringAppend(pjVar4,(char *)zData,nLen);
    if (pbVar8 <= zIn) {
LAB_00126a00:
      if (1 < iCons) {
        jx9VmEmitInstr(local_48->pVm,0xc,iCons,0,(void *)0x0,(sxu32 *)0x0);
        return 0;
      }
      return 0;
    }
    if (*zIn != 0x5c) {
      pbVar6 = zIn;
      if (*zIn != 0x7b) {
        do {
          if ((pbVar8 <= pbVar6) || (*pbVar6 != 0x24)) {
LAB_001266c0:
            bVar1 = *pbVar6;
            if (pbVar8 <= pbVar6) {
              if (bVar1 < 0xc0) goto LAB_0012675f;
LAB_001266f2:
              pbVar6 = pbVar6 + 1;
              goto LAB_001266c0;
            }
            if (0xbf < bVar1) goto LAB_001266f2;
            ppuVar5 = __ctype_b_loc();
            if ((bVar1 == 0x5f) || (((*ppuVar5)[(char)bVar1] & 8) != 0)) {
              pbVar6 = pbVar6 + 1;
              goto LAB_001266c0;
            }
            if (bVar1 != 0x2e) goto code_r0x00126719;
          }
          pbVar6 = pbVar6 + 1;
        } while( true );
      }
      iVar2 = 1;
      pbVar6 = pbVar7 + lVar10 + 1;
      goto LAB_001269a7;
    }
    zData_00 = (char *)(pbVar7 + lVar10 + 1);
    if (pbVar8 <= zData_00) goto LAB_00126a00;
    bVar1 = *zData_00;
    switch(bVar1) {
    case 0x6e:
      zData_00 = "\n";
      break;
    case 0x6f:
      local_40 = pjVar4;
      if (pbVar7 + lVar10 + 2 < pbVar8) {
        bVar1 = pbVar7[lVar10 + 2];
        if ((((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) &&
            (ppuVar5 = __ctype_b_loc(), pjVar4 = local_40, (char)bVar1 < '8')) &&
           (((*ppuVar5)[(char)bVar1] & 0x800) != 0)) {
          c = 0;
          lVar9 = 0;
          for (; (lVar9 + 2U < 5 && (pbVar6 < pbVar8)); pbVar6 = pbVar6 + 1) {
            bVar1 = *pbVar6;
            if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
               (('7' < (char)bVar1 || (((*ppuVar5)[(char)bVar1] & 0x800) == 0)))) break;
            c = (int)(char)bVar1 + c * 8 + -0x30;
            lVar9 = lVar9 + 1;
          }
          if (0 < c) {
            jx9MemObjStringAppend(local_40,(char *)&c,1);
          }
          lStack_60 = 2;
          goto LAB_00126913;
        }
      }
      zData_00 = "o";
      pjVar4 = local_40;
      break;
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
switchD_00126790_caseD_70:
      break;
    case 0x72:
      zData_00 = "\r";
      break;
    case 0x74:
      zData_00 = "\t";
      break;
    case 0x76:
      zData_00 = "\v";
      break;
    case 0x78:
      bVar1 = pbVar7[lVar10 + 2];
      if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
         (ppuVar5 = __ctype_b_loc(),
         (*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 0x10) == 0)) {
        zData_00 = "x";
        break;
      }
      sVar3 = SyHexToint((int)(char)bVar1);
      iVar2 = sVar3 * 0x10;
      c_1 = iVar2;
      if (pbVar7 + lVar10 + 3 < pbVar8) {
        sVar3 = SyHexToint((int)(char)pbVar7[lVar10 + 3]);
        c_1 = sVar3 + iVar2;
      }
      jx9MemObjStringAppend(pjVar4,(char *)&c_1,1);
      lVar9 = 3;
      lStack_60 = 1;
      goto LAB_00126913;
    default:
      if (bVar1 == 0x22) {
        zData_00 = "\"";
      }
      else if (bVar1 == 0x66) {
        zData_00 = "\f";
      }
      else if (bVar1 == 0x27) {
        zData_00 = "\'";
      }
      else if (bVar1 == 0x30) {
        zData_00 = "";
      }
      else if (bVar1 == 0x5c) {
        zData_00 = "\\";
      }
      else if (bVar1 == 0x61) {
        zData_00 = "\a";
      }
      else if (bVar1 == 0x62) {
        zData_00 = "\b";
      }
      else {
        if (bVar1 != 0x24) goto switchD_00126790_caseD_70;
        zData_00 = "$";
      }
    }
    jx9MemObjStringAppend(pjVar4,zData_00,1);
    lStack_60 = 1;
    lVar9 = lStack_60;
LAB_00126913:
    pbVar7 = pbVar7 + lVar10 + lStack_60 + lVar9;
  } while( true );
code_r0x00126719:
  if (bVar1 == 0x5b) {
    iVar2 = 1;
    while (pbVar7 = pbVar6 + 1, pbVar7 < pbVar8) {
      if (*pbVar7 == 0x5d) {
        if (iVar2 < 2) break;
        iVar2 = iVar2 + -1;
        pbVar6 = pbVar7;
      }
      else {
        pbVar6 = pbVar7;
        if (*pbVar7 == 0x5b) {
          iVar2 = iVar2 + 1;
        }
      }
    }
    pbVar6 = pbVar6 + 2;
    if (pbVar8 <= pbVar7) {
      pbVar6 = pbVar7;
    }
  }
LAB_0012675f:
  sVar3 = GenStateProcessStringExpression(local_48,(char *)zIn,(char *)pbVar6);
  pjVar4 = (jx9_value *)0x0;
  pbVar7 = pbVar6;
  if (sVar3 != -3) goto LAB_001269f2;
  goto LAB_00126555;
LAB_001269f2:
  if (sVar3 == -10) {
    return -10;
  }
  iCons = iCons + 1;
  goto LAB_00126553;
LAB_001269a7:
  if (pbVar8 <= pbVar6) goto LAB_001269cb;
  if (*pbVar6 == 0x7d) {
    if (iVar2 < 2) goto LAB_001269cb;
    iVar2 = iVar2 + -1;
  }
  else if (*pbVar6 == 0x7b) {
    iVar2 = iVar2 + 1;
  }
  pbVar6 = pbVar6 + 1;
  goto LAB_001269a7;
LAB_001269cb:
  sVar3 = GenStateProcessStringExpression(local_48,(char *)(pbVar7 + lVar10 + 1),(char *)pbVar6);
  if (sVar3 != -3) {
    if (sVar3 == -10) {
      return -10;
    }
    iCons = iCons + 1;
  }
  pbVar6 = pbVar6 + (pbVar6 < pbVar8);
  goto LAB_00126553;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileString(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	sxi32 rc;
	rc = GenStateCompileString(&(*pGen));
	SXUNUSED(iCompileFlag); /* cc warning */
	/* Compilation result */
	return rc;
}